

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::UnaryOp_x86_fma::forward_inplace(UnaryOp_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  size_t sVar1;
  size_t sVar2;
  void *pvVar3;
  undefined1 auVar4 [32];
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 (*pauVar8) [32];
  int iVar9;
  long lVar10;
  float *pfVar11;
  int iVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  __m256 afVar16;
  undefined1 auVar29 [56];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar42 [64];
  undefined1 in_XMM11 [16];
  __m128 afVar43;
  unary_op_tanh op;
  unary_op_tanh local_a9;
  Mat *local_a8;
  ulong local_a0;
  size_t local_98;
  size_t local_90;
  ulong local_88;
  __m256 local_80 [2];
  
  local_a8 = bottom_top_blob;
  switch(*(undefined4 *)(&this->field_0xd0 + (long)this->_vptr_UnaryOp_x86_fma[-3])) {
  case 0:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar7 = 0;
    uVar6 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar6 = uVar7;
    }
    auVar15._8_4_ = 0x7fffffff;
    auVar15._0_8_ = 0x7fffffff7fffffff;
    auVar15._12_4_ = 0x7fffffff;
    auVar15._16_4_ = 0x7fffffff;
    auVar15._20_4_ = 0x7fffffff;
    auVar15._24_4_ = 0x7fffffff;
    auVar15._28_4_ = 0x7fffffff;
    auVar30._8_4_ = 0x7fffffff;
    auVar30._0_8_ = 0x7fffffff7fffffff;
    auVar30._12_4_ = 0x7fffffff;
    for (; uVar7 != uVar6; uVar7 = uVar7 + 1) {
      pvVar3 = bottom_top_blob->data;
      sVar1 = bottom_top_blob->elemsize;
      sVar2 = bottom_top_blob->cstep;
      pauVar8 = (undefined1 (*) [32])(sVar2 * uVar7 * sVar1 + (long)pvVar3);
      lVar10 = 0;
      for (iVar12 = 0; iVar12 + 7 < iVar9; iVar12 = iVar12 + 8) {
        auVar17 = vandps_avx(auVar15,*pauVar8);
        *pauVar8 = auVar17;
        pauVar8 = pauVar8 + 1;
        lVar10 = lVar10 + 8;
      }
      for (; iVar12 + 3 < iVar9; iVar12 = iVar12 + 4) {
        auVar31 = vandps_avx(auVar30,*(undefined1 (*) [16])*pauVar8);
        *(undefined1 (*) [16])*pauVar8 = auVar31;
        pauVar8 = (undefined1 (*) [32])(*pauVar8 + 0x10);
        lVar10 = lVar10 + 4;
      }
      lVar5 = sVar2 * sVar1 * uVar7;
      for (; (int)lVar10 < iVar9; lVar10 = lVar10 + 1) {
        auVar31 = vandps_avx(ZEXT416(*(uint *)((long)pvVar3 + lVar10 * 4 + lVar5)),auVar30);
        *(int *)((long)pvVar3 + lVar10 * 4 + lVar5) = auVar31._0_4_;
      }
    }
    break;
  case 1:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar7 = 0;
    uVar6 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar6 = uVar7;
    }
    for (; uVar7 != uVar6; uVar7 = uVar7 + 1) {
      pvVar3 = bottom_top_blob->data;
      sVar1 = bottom_top_blob->elemsize;
      sVar2 = bottom_top_blob->cstep;
      pauVar8 = (undefined1 (*) [32])(sVar2 * uVar7 * sVar1 + (long)pvVar3);
      lVar10 = 0;
      for (iVar12 = 0; iVar12 + 7 < iVar9; iVar12 = iVar12 + 8) {
        auVar17 = *pauVar8;
        auVar33._0_8_ = auVar17._0_8_ ^ 0x8000000080000000;
        auVar33._8_4_ = auVar17._8_4_ ^ 0x80000000;
        auVar33._12_4_ = auVar17._12_4_ ^ 0x80000000;
        auVar33._16_4_ = auVar17._16_4_ ^ 0x80000000;
        auVar33._20_4_ = auVar17._20_4_ ^ 0x80000000;
        auVar33._24_4_ = auVar17._24_4_ ^ 0x80000000;
        auVar33._28_4_ = auVar17._28_4_ ^ 0x80000000;
        *pauVar8 = auVar33;
        pauVar8 = pauVar8 + 1;
        lVar10 = lVar10 + 8;
      }
      for (; iVar12 + 3 < iVar9; iVar12 = iVar12 + 4) {
        auVar31 = *(undefined1 (*) [16])*pauVar8;
        auVar32._0_8_ = auVar31._0_8_ ^ 0x8000000080000000;
        auVar32._8_4_ = auVar31._8_4_ ^ 0x80000000;
        auVar32._12_4_ = auVar31._12_4_ ^ 0x80000000;
        *(undefined1 (*) [16])*pauVar8 = auVar32;
        pauVar8 = (undefined1 (*) [32])(*pauVar8 + 0x10);
        lVar10 = lVar10 + 4;
      }
      lVar5 = sVar2 * sVar1 * uVar7;
      for (; (int)lVar10 < iVar9; lVar10 = lVar10 + 1) {
        *(uint *)((long)pvVar3 + lVar10 * 4 + lVar5) =
             *(uint *)((long)pvVar3 + lVar10 * 4 + lVar5) ^ 0x80000000;
      }
    }
    break;
  case 2:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar7 = 0;
    uVar6 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar6 = uVar7;
    }
    for (; uVar7 != uVar6; uVar7 = uVar7 + 1) {
      pvVar3 = bottom_top_blob->data;
      sVar1 = bottom_top_blob->elemsize;
      sVar2 = bottom_top_blob->cstep;
      pauVar8 = (undefined1 (*) [32])(sVar2 * uVar7 * sVar1 + (long)pvVar3);
      lVar10 = 0;
      for (iVar12 = 0; iVar12 + 7 < iVar9; iVar12 = iVar12 + 8) {
        auVar17 = vroundps_avx(*pauVar8,1);
        *pauVar8 = auVar17;
        pauVar8 = pauVar8 + 1;
        lVar10 = lVar10 + 8;
      }
      for (; iVar12 + 3 < iVar9; iVar12 = iVar12 + 4) {
        auVar31 = vroundps_avx(*(undefined1 (*) [16])*pauVar8,1);
        *(undefined1 (*) [16])*pauVar8 = auVar31;
        pauVar8 = (undefined1 (*) [32])(*pauVar8 + 0x10);
        lVar10 = lVar10 + 4;
      }
      lVar5 = sVar2 * sVar1 * uVar7;
      for (; (int)lVar10 < iVar9; lVar10 = lVar10 + 1) {
        auVar31 = vroundss_avx(in_ZMM1._0_16_,ZEXT416(*(uint *)((long)pvVar3 + lVar10 * 4 + lVar5)),
                               9);
        *(int *)((long)pvVar3 + lVar10 * 4 + lVar5) = auVar31._0_4_;
      }
    }
    break;
  case 3:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar7 = 0;
    uVar6 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar6 = uVar7;
    }
    for (; uVar7 != uVar6; uVar7 = uVar7 + 1) {
      pvVar3 = bottom_top_blob->data;
      sVar1 = bottom_top_blob->elemsize;
      sVar2 = bottom_top_blob->cstep;
      pauVar8 = (undefined1 (*) [32])(sVar2 * uVar7 * sVar1 + (long)pvVar3);
      lVar10 = 0;
      for (iVar12 = 0; iVar12 + 7 < iVar9; iVar12 = iVar12 + 8) {
        auVar17 = vroundps_avx(*pauVar8,2);
        *pauVar8 = auVar17;
        pauVar8 = pauVar8 + 1;
        lVar10 = lVar10 + 8;
      }
      for (; iVar12 + 3 < iVar9; iVar12 = iVar12 + 4) {
        auVar31 = vroundps_avx(*(undefined1 (*) [16])*pauVar8,2);
        *(undefined1 (*) [16])*pauVar8 = auVar31;
        pauVar8 = (undefined1 (*) [32])(*pauVar8 + 0x10);
        lVar10 = lVar10 + 4;
      }
      lVar5 = sVar2 * sVar1 * uVar7;
      for (; (int)lVar10 < iVar9; lVar10 = lVar10 + 1) {
        auVar31 = vroundss_avx(in_ZMM1._0_16_,ZEXT416(*(uint *)((long)pvVar3 + lVar10 * 4 + lVar5)),
                               10);
        *(int *)((long)pvVar3 + lVar10 * 4 + lVar5) = auVar31._0_4_;
      }
    }
    break;
  case 4:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar7 = 0;
    uVar6 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar6 = uVar7;
    }
    for (; uVar7 != uVar6; uVar7 = uVar7 + 1) {
      pvVar3 = bottom_top_blob->data;
      sVar1 = bottom_top_blob->elemsize;
      sVar2 = bottom_top_blob->cstep;
      pauVar8 = (undefined1 (*) [32])(sVar2 * uVar7 * sVar1 + (long)pvVar3);
      lVar10 = 0;
      for (iVar12 = 0; iVar12 + 7 < iVar9; iVar12 = iVar12 + 8) {
        auVar4._4_4_ = *(float *)(*pauVar8 + 4) * *(float *)(*pauVar8 + 4);
        auVar4._0_4_ = *(float *)*pauVar8 * *(float *)*pauVar8;
        auVar4._8_4_ = *(float *)(*pauVar8 + 8) * *(float *)(*pauVar8 + 8);
        auVar4._12_4_ = *(float *)(*pauVar8 + 0xc) * *(float *)(*pauVar8 + 0xc);
        auVar4._16_4_ = *(float *)(*pauVar8 + 0x10) * *(float *)(*pauVar8 + 0x10);
        auVar4._20_4_ = *(float *)(*pauVar8 + 0x14) * *(float *)(*pauVar8 + 0x14);
        auVar4._24_4_ = *(float *)(*pauVar8 + 0x18) * *(float *)(*pauVar8 + 0x18);
        auVar4._28_4_ = *(undefined4 *)(*pauVar8 + 0x1c);
        *pauVar8 = auVar4;
        pauVar8 = pauVar8 + 1;
        lVar10 = lVar10 + 8;
      }
      for (; iVar12 + 3 < iVar9; iVar12 = iVar12 + 4) {
        auVar14._0_4_ = *(float *)*pauVar8 * *(float *)*pauVar8;
        auVar14._4_4_ = *(float *)(*pauVar8 + 4) * *(float *)(*pauVar8 + 4);
        auVar14._8_4_ = *(float *)(*pauVar8 + 8) * *(float *)(*pauVar8 + 8);
        auVar14._12_4_ = *(float *)(*pauVar8 + 0xc) * *(float *)(*pauVar8 + 0xc);
        *(undefined1 (*) [16])*pauVar8 = auVar14;
        pauVar8 = (undefined1 (*) [32])(*pauVar8 + 0x10);
        lVar10 = lVar10 + 4;
      }
      lVar5 = sVar2 * sVar1 * uVar7;
      for (; (int)lVar10 < iVar9; lVar10 = lVar10 + 1) {
        fVar13 = *(float *)((long)pvVar3 + lVar10 * 4 + lVar5);
        *(float *)((long)pvVar3 + lVar10 * 4 + lVar5) = fVar13 * fVar13;
      }
    }
    break;
  case 5:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar7 = 0;
    uVar6 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar6 = uVar7;
    }
    auVar18._8_4_ = 0xc0400000;
    auVar18._0_8_ = 0xc0400000c0400000;
    auVar18._12_4_ = 0xc0400000;
    auVar18._16_4_ = 0xc0400000;
    auVar18._20_4_ = 0xc0400000;
    auVar18._24_4_ = 0xc0400000;
    auVar18._28_4_ = 0xc0400000;
    auVar34._8_4_ = 0x7fffffff;
    auVar34._0_8_ = 0x7fffffff7fffffff;
    auVar34._12_4_ = 0x7fffffff;
    auVar34._16_4_ = 0x7fffffff;
    auVar34._20_4_ = 0x7fffffff;
    auVar34._24_4_ = 0x7fffffff;
    auVar34._28_4_ = 0x7fffffff;
    auVar35._8_4_ = 0x800000;
    auVar35._0_8_ = 0x80000000800000;
    auVar35._12_4_ = 0x800000;
    auVar35._16_4_ = 0x800000;
    auVar35._20_4_ = 0x800000;
    auVar35._24_4_ = 0x800000;
    auVar35._28_4_ = 0x800000;
    auVar36._8_4_ = 0xc0400000;
    auVar36._0_8_ = 0xc0400000c0400000;
    auVar36._12_4_ = 0xc0400000;
    auVar37._8_4_ = 0x7fffffff;
    auVar37._0_8_ = 0x7fffffff7fffffff;
    auVar37._12_4_ = 0x7fffffff;
    auVar38._8_4_ = 0x800000;
    auVar38._0_8_ = 0x80000000800000;
    auVar38._12_4_ = 0x800000;
    for (; uVar7 != uVar6; uVar7 = uVar7 + 1) {
      pvVar3 = bottom_top_blob->data;
      sVar1 = bottom_top_blob->elemsize;
      sVar2 = bottom_top_blob->cstep;
      pauVar8 = (undefined1 (*) [32])(sVar2 * uVar7 * sVar1 + (long)pvVar3);
      lVar10 = 0;
      for (iVar12 = 0; iVar12 + 7 < iVar9; iVar12 = iVar12 + 8) {
        auVar17 = *pauVar8;
        auVar40 = vrsqrtps_avx(auVar17);
        auVar42._0_4_ = auVar17._0_4_ * auVar40._0_4_;
        auVar42._4_4_ = auVar17._4_4_ * auVar40._4_4_;
        auVar42._8_4_ = auVar17._8_4_ * auVar40._8_4_;
        auVar42._12_4_ = auVar17._12_4_ * auVar40._12_4_;
        auVar42._16_4_ = auVar17._16_4_ * auVar40._16_4_;
        auVar42._20_4_ = auVar17._20_4_ * auVar40._20_4_;
        auVar42._28_36_ = in_ZMM10._28_36_;
        auVar42._24_4_ = auVar17._24_4_ * auVar40._24_4_;
        auVar31 = vfmadd213ps_fma(auVar40,auVar42._0_32_,auVar18);
        in_ZMM10 = ZEXT3264(CONCAT428(in_ZMM10._28_4_,
                                      CONCAT424(auVar42._24_4_ * -0.5,
                                                CONCAT420(auVar42._20_4_ * -0.5,
                                                          CONCAT416(auVar42._16_4_ * -0.5,
                                                                    CONCAT412(auVar42._12_4_ * -0.5,
                                                                              CONCAT48(auVar42._8_4_
                                                                                       * -0.5,
                                                  CONCAT44(auVar42._4_4_ * -0.5,auVar42._0_4_ * -0.5
                                                          ))))))));
        auVar40._0_4_ = auVar42._0_4_ * -0.5 * auVar31._0_4_;
        auVar40._4_4_ = auVar42._4_4_ * -0.5 * auVar31._4_4_;
        auVar40._8_4_ = auVar42._8_4_ * -0.5 * auVar31._8_4_;
        auVar40._12_4_ = auVar42._12_4_ * -0.5 * auVar31._12_4_;
        auVar40._16_4_ = auVar42._16_4_ * -0.5 * 0.0;
        auVar40._20_4_ = auVar42._20_4_ * -0.5 * 0.0;
        auVar40._24_4_ = auVar42._24_4_ * -0.5 * 0.0;
        auVar40._28_4_ = 0;
        auVar17 = vandps_avx(auVar17,auVar34);
        auVar17 = vcmpps_avx(auVar35,auVar17,2);
        auVar17 = vandps_avx(auVar17,auVar40);
        *pauVar8 = auVar17;
        pauVar8 = pauVar8 + 1;
        lVar10 = lVar10 + 8;
      }
      for (; iVar12 + 3 < iVar9; iVar12 = iVar12 + 4) {
        auVar31 = *(undefined1 (*) [16])*pauVar8;
        auVar14 = vrsqrtps_avx(auVar31);
        auVar41._0_4_ = auVar31._0_4_ * auVar14._0_4_;
        auVar41._4_4_ = auVar31._4_4_ * auVar14._4_4_;
        auVar41._8_4_ = auVar31._8_4_ * auVar14._8_4_;
        auVar41._12_4_ = auVar31._12_4_ * auVar14._12_4_;
        auVar14 = vfmadd213ps_fma(auVar14,auVar41,auVar36);
        in_ZMM10 = ZEXT1664(CONCAT412(auVar41._12_4_ * -0.5,
                                      CONCAT48(auVar41._8_4_ * -0.5,
                                               CONCAT44(auVar41._4_4_ * -0.5,auVar41._0_4_ * -0.5)))
                           );
        auVar39._0_4_ = auVar41._0_4_ * -0.5 * auVar14._0_4_;
        auVar39._4_4_ = auVar41._4_4_ * -0.5 * auVar14._4_4_;
        auVar39._8_4_ = auVar41._8_4_ * -0.5 * auVar14._8_4_;
        auVar39._12_4_ = auVar41._12_4_ * -0.5 * auVar14._12_4_;
        auVar31 = vandps_avx(auVar31,auVar37);
        auVar31 = vcmpps_avx(auVar38,auVar31,2);
        auVar31 = vandps_avx(auVar31,auVar39);
        *(undefined1 (*) [16])*pauVar8 = auVar31;
        pauVar8 = (undefined1 (*) [32])(*pauVar8 + 0x10);
        lVar10 = lVar10 + 4;
      }
      lVar5 = sVar2 * sVar1 * uVar7;
      for (; (int)lVar10 < iVar9; lVar10 = lVar10 + 1) {
        auVar31 = vsqrtss_avx(in_XMM11,ZEXT416(*(uint *)((long)pvVar3 + lVar10 * 4 + lVar5)));
        *(int *)((long)pvVar3 + lVar10 * 4 + lVar5) = auVar31._0_4_;
      }
    }
    break;
  case 6:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar7 = 0;
    uVar6 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar6 = uVar7;
    }
    for (; uVar7 != uVar6; uVar7 = uVar7 + 1) {
      pvVar3 = bottom_top_blob->data;
      sVar1 = bottom_top_blob->elemsize;
      sVar2 = bottom_top_blob->cstep;
      pauVar8 = (undefined1 (*) [32])(sVar2 * uVar7 * sVar1 + (long)pvVar3);
      lVar10 = 0;
      for (iVar12 = 0; iVar12 + 7 < iVar9; iVar12 = iVar12 + 8) {
        auVar17 = vrsqrtps_avx(*pauVar8);
        *pauVar8 = auVar17;
        pauVar8 = pauVar8 + 1;
        lVar10 = lVar10 + 8;
      }
      for (; iVar12 + 3 < iVar9; iVar12 = iVar12 + 4) {
        auVar31 = vrsqrtps_avx(*(undefined1 (*) [16])*pauVar8);
        *(undefined1 (*) [16])*pauVar8 = auVar31;
        pauVar8 = (undefined1 (*) [32])(*pauVar8 + 0x10);
        lVar10 = lVar10 + 4;
      }
      lVar5 = sVar2 * sVar1 * uVar7;
      for (; (int)lVar10 < iVar9; lVar10 = lVar10 + 1) {
        fVar13 = *(float *)((long)pvVar3 + lVar10 * 4 + lVar5);
        auVar31 = vrsqrtss_avx(ZEXT416((uint)fVar13),ZEXT416((uint)fVar13));
        auVar36 = vfmadd213ss_fma(ZEXT416((uint)(fVar13 * auVar31._0_4_)),auVar31,
                                  SUB6416(ZEXT464(0xc0400000),0));
        *(float *)((long)pvVar3 + lVar10 * 4 + lVar5) = auVar31._0_4_ * -0.5 * auVar36._0_4_;
      }
    }
    break;
  case 7:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    local_88 = 0;
    local_a0 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_a0 = local_88;
    }
    while (local_88 != local_a0) {
      pvVar3 = local_a8->data;
      local_98 = local_a8->elemsize;
      local_90 = local_a8->cstep;
      pfVar11 = (float *)(local_90 * local_88 * local_98 + (long)pvVar3);
      lVar10 = 0;
      for (iVar12 = 0; iVar12 + 7 < iVar9; iVar12 = iVar12 + 8) {
        local_80[0] = *(__m256 *)pfVar11;
        afVar16 = local_80[0];
        UnaryOp_x86_fma_functor::unary_op_exp::func_pack8((unary_op_exp *)&local_a9,local_80);
        *(__m256 *)pfVar11 = afVar16;
        pfVar11 = pfVar11 + 8;
        lVar10 = lVar10 + 8;
      }
      for (; uVar6 = local_88, iVar12 + 3 < iVar9; iVar12 = iVar12 + 4) {
        local_80[0]._0_16_ = *(undefined1 (*) [16])pfVar11;
        auVar29 = ZEXT856(*(ulong *)(pfVar11 + 2));
        afVar43 = UnaryOp_x86_fma_functor::unary_op_exp::func_pack4
                            ((unary_op_exp *)&local_a9,(__m128 *)local_80);
        auVar24._0_8_ = afVar43._0_8_;
        auVar24._8_56_ = auVar29;
        *(undefined1 (*) [16])pfVar11 = auVar24._0_16_;
        pfVar11 = pfVar11 + 4;
        lVar10 = lVar10 + 4;
      }
      lVar5 = local_90 * local_98 * local_88;
      for (; (int)lVar10 < iVar9; lVar10 = lVar10 + 1) {
        fVar13 = expf(*(float *)((long)pvVar3 + lVar10 * 4 + lVar5));
        *(float *)((long)pvVar3 + lVar10 * 4 + lVar5) = fVar13;
      }
      local_88 = uVar6 + 1;
    }
    break;
  case 8:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    local_88 = 0;
    local_a0 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_a0 = local_88;
    }
    while (local_88 != local_a0) {
      pvVar3 = local_a8->data;
      local_98 = local_a8->elemsize;
      local_90 = local_a8->cstep;
      pfVar11 = (float *)(local_90 * local_88 * local_98 + (long)pvVar3);
      lVar10 = 0;
      for (iVar12 = 0; iVar12 + 7 < iVar9; iVar12 = iVar12 + 8) {
        local_80[0] = *(__m256 *)pfVar11;
        afVar16 = local_80[0];
        UnaryOp_x86_fma_functor::unary_op_log::func_pack8((unary_op_log *)&local_a9,local_80);
        *(__m256 *)pfVar11 = afVar16;
        pfVar11 = pfVar11 + 8;
        lVar10 = lVar10 + 8;
      }
      for (; uVar6 = local_88, iVar12 + 3 < iVar9; iVar12 = iVar12 + 4) {
        local_80[0]._0_16_ = *(undefined1 (*) [16])pfVar11;
        auVar29 = ZEXT856(*(ulong *)(pfVar11 + 2));
        afVar43 = UnaryOp_x86_fma_functor::unary_op_log::func_pack4
                            ((unary_op_log *)&local_a9,(__m128 *)local_80);
        auVar28._0_8_ = afVar43._0_8_;
        auVar28._8_56_ = auVar29;
        *(undefined1 (*) [16])pfVar11 = auVar28._0_16_;
        pfVar11 = pfVar11 + 4;
        lVar10 = lVar10 + 4;
      }
      lVar5 = local_90 * local_98 * local_88;
      for (; (int)lVar10 < iVar9; lVar10 = lVar10 + 1) {
        fVar13 = logf(*(float *)((long)pvVar3 + lVar10 * 4 + lVar5));
        *(float *)((long)pvVar3 + lVar10 * 4 + lVar5) = fVar13;
      }
      local_88 = uVar6 + 1;
    }
    break;
  case 9:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    local_88 = 0;
    local_a0 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_a0 = local_88;
    }
    while (local_88 != local_a0) {
      pvVar3 = local_a8->data;
      local_98 = local_a8->elemsize;
      local_90 = local_a8->cstep;
      pfVar11 = (float *)(local_90 * local_88 * local_98 + (long)pvVar3);
      lVar10 = 0;
      for (iVar12 = 0; iVar12 + 7 < iVar9; iVar12 = iVar12 + 8) {
        local_80[0] = *(__m256 *)pfVar11;
        afVar16 = local_80[0];
        UnaryOp_x86_fma_functor::unary_op_sin::func_pack8((unary_op_sin *)&local_a9,local_80);
        *(__m256 *)pfVar11 = afVar16;
        pfVar11 = pfVar11 + 8;
        lVar10 = lVar10 + 8;
      }
      for (; uVar6 = local_88, iVar12 + 3 < iVar9; iVar12 = iVar12 + 4) {
        local_80[0]._0_16_ = *(undefined1 (*) [16])pfVar11;
        auVar29 = ZEXT856(*(ulong *)(pfVar11 + 2));
        afVar43 = UnaryOp_x86_fma_functor::unary_op_sin::func_pack4
                            ((unary_op_sin *)&local_a9,(__m128 *)local_80);
        auVar23._0_8_ = afVar43._0_8_;
        auVar23._8_56_ = auVar29;
        *(undefined1 (*) [16])pfVar11 = auVar23._0_16_;
        pfVar11 = pfVar11 + 4;
        lVar10 = lVar10 + 4;
      }
      lVar5 = local_90 * local_98 * local_88;
      for (; (int)lVar10 < iVar9; lVar10 = lVar10 + 1) {
        fVar13 = sinf(*(float *)((long)pvVar3 + lVar10 * 4 + lVar5));
        *(float *)((long)pvVar3 + lVar10 * 4 + lVar5) = fVar13;
      }
      local_88 = uVar6 + 1;
    }
    break;
  case 10:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    local_88 = 0;
    local_a0 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_a0 = local_88;
    }
    while (local_88 != local_a0) {
      pvVar3 = local_a8->data;
      local_98 = local_a8->elemsize;
      local_90 = local_a8->cstep;
      pfVar11 = (float *)(local_90 * local_88 * local_98 + (long)pvVar3);
      lVar10 = 0;
      for (iVar12 = 0; iVar12 + 7 < iVar9; iVar12 = iVar12 + 8) {
        local_80[0] = *(__m256 *)pfVar11;
        afVar16 = local_80[0];
        UnaryOp_x86_fma_functor::unary_op_cos::func_pack8((unary_op_cos *)&local_a9,local_80);
        *(__m256 *)pfVar11 = afVar16;
        pfVar11 = pfVar11 + 8;
        lVar10 = lVar10 + 8;
      }
      for (; uVar6 = local_88, iVar12 + 3 < iVar9; iVar12 = iVar12 + 4) {
        local_80[0]._0_16_ = *(undefined1 (*) [16])pfVar11;
        auVar29 = ZEXT856(*(ulong *)(pfVar11 + 2));
        afVar43 = UnaryOp_x86_fma_functor::unary_op_cos::func_pack4
                            ((unary_op_cos *)&local_a9,(__m128 *)local_80);
        auVar27._0_8_ = afVar43._0_8_;
        auVar27._8_56_ = auVar29;
        *(undefined1 (*) [16])pfVar11 = auVar27._0_16_;
        pfVar11 = pfVar11 + 4;
        lVar10 = lVar10 + 4;
      }
      lVar5 = local_90 * local_98 * local_88;
      for (; (int)lVar10 < iVar9; lVar10 = lVar10 + 1) {
        fVar13 = cosf(*(float *)((long)pvVar3 + lVar10 * 4 + lVar5));
        *(float *)((long)pvVar3 + lVar10 * 4 + lVar5) = fVar13;
      }
      local_88 = uVar6 + 1;
    }
    break;
  case 0xb:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    local_88 = 0;
    local_a0 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_a0 = local_88;
    }
    while (local_88 != local_a0) {
      pvVar3 = local_a8->data;
      local_98 = local_a8->elemsize;
      local_90 = local_a8->cstep;
      pfVar11 = (float *)(local_90 * local_88 * local_98 + (long)pvVar3);
      lVar10 = 0;
      for (iVar12 = 0; iVar12 + 7 < iVar9; iVar12 = iVar12 + 8) {
        local_80[0] = *(__m256 *)pfVar11;
        afVar16 = local_80[0];
        UnaryOp_x86_fma_functor::unary_op_tan::func_pack8((unary_op_tan *)&local_a9,local_80);
        *(__m256 *)pfVar11 = afVar16;
        pfVar11 = pfVar11 + 8;
        lVar10 = lVar10 + 8;
      }
      for (; uVar6 = local_88, iVar12 + 3 < iVar9; iVar12 = iVar12 + 4) {
        local_80[0]._0_16_ = *(undefined1 (*) [16])pfVar11;
        auVar29 = ZEXT856(*(ulong *)(pfVar11 + 2));
        afVar43 = UnaryOp_x86_fma_functor::unary_op_tan::func_pack4
                            ((unary_op_tan *)&local_a9,(__m128 *)local_80);
        auVar21._0_8_ = afVar43._0_8_;
        auVar21._8_56_ = auVar29;
        *(undefined1 (*) [16])pfVar11 = auVar21._0_16_;
        pfVar11 = pfVar11 + 4;
        lVar10 = lVar10 + 4;
      }
      lVar5 = local_90 * local_98 * local_88;
      for (; (int)lVar10 < iVar9; lVar10 = lVar10 + 1) {
        fVar13 = tanf(*(float *)((long)pvVar3 + lVar10 * 4 + lVar5));
        *(float *)((long)pvVar3 + lVar10 * 4 + lVar5) = fVar13;
      }
      local_88 = uVar6 + 1;
    }
    break;
  case 0xc:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    local_88 = 0;
    local_a0 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_a0 = local_88;
    }
    while (local_88 != local_a0) {
      pvVar3 = local_a8->data;
      local_98 = local_a8->elemsize;
      local_90 = local_a8->cstep;
      pfVar11 = (float *)(local_90 * local_88 * local_98 + (long)pvVar3);
      lVar10 = 0;
      for (iVar12 = 0; iVar12 + 7 < iVar9; iVar12 = iVar12 + 8) {
        local_80[0] = *(__m256 *)pfVar11;
        afVar16 = local_80[0];
        UnaryOp_x86_fma_functor::unary_op_asin::func_pack8((unary_op_asin *)&local_a9,local_80);
        *(__m256 *)pfVar11 = afVar16;
        pfVar11 = pfVar11 + 8;
        lVar10 = lVar10 + 8;
      }
      for (; uVar6 = local_88, iVar12 + 3 < iVar9; iVar12 = iVar12 + 4) {
        local_80[0]._0_16_ = *(undefined1 (*) [16])pfVar11;
        auVar29 = ZEXT856(*(ulong *)(pfVar11 + 2));
        afVar43 = UnaryOp_x86_fma_functor::unary_op_asin::func_pack4
                            ((unary_op_asin *)&local_a9,(__m128 *)local_80);
        auVar22._0_8_ = afVar43._0_8_;
        auVar22._8_56_ = auVar29;
        *(undefined1 (*) [16])pfVar11 = auVar22._0_16_;
        pfVar11 = pfVar11 + 4;
        lVar10 = lVar10 + 4;
      }
      lVar5 = local_90 * local_98 * local_88;
      for (; (int)lVar10 < iVar9; lVar10 = lVar10 + 1) {
        fVar13 = asinf(*(float *)((long)pvVar3 + lVar10 * 4 + lVar5));
        *(float *)((long)pvVar3 + lVar10 * 4 + lVar5) = fVar13;
      }
      local_88 = uVar6 + 1;
    }
    break;
  case 0xd:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    local_88 = 0;
    local_a0 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_a0 = local_88;
    }
    while (local_88 != local_a0) {
      pvVar3 = local_a8->data;
      local_98 = local_a8->elemsize;
      local_90 = local_a8->cstep;
      pfVar11 = (float *)(local_90 * local_88 * local_98 + (long)pvVar3);
      lVar10 = 0;
      for (iVar12 = 0; iVar12 + 7 < iVar9; iVar12 = iVar12 + 8) {
        local_80[0] = *(__m256 *)pfVar11;
        afVar16 = local_80[0];
        UnaryOp_x86_fma_functor::unary_op_acos::func_pack8((unary_op_acos *)&local_a9,local_80);
        *(__m256 *)pfVar11 = afVar16;
        pfVar11 = pfVar11 + 8;
        lVar10 = lVar10 + 8;
      }
      for (; uVar6 = local_88, iVar12 + 3 < iVar9; iVar12 = iVar12 + 4) {
        local_80[0]._0_16_ = *(undefined1 (*) [16])pfVar11;
        auVar29 = ZEXT856(*(ulong *)(pfVar11 + 2));
        afVar43 = UnaryOp_x86_fma_functor::unary_op_acos::func_pack4
                            ((unary_op_acos *)&local_a9,(__m128 *)local_80);
        auVar26._0_8_ = afVar43._0_8_;
        auVar26._8_56_ = auVar29;
        *(undefined1 (*) [16])pfVar11 = auVar26._0_16_;
        pfVar11 = pfVar11 + 4;
        lVar10 = lVar10 + 4;
      }
      lVar5 = local_90 * local_98 * local_88;
      for (; (int)lVar10 < iVar9; lVar10 = lVar10 + 1) {
        fVar13 = acosf(*(float *)((long)pvVar3 + lVar10 * 4 + lVar5));
        *(float *)((long)pvVar3 + lVar10 * 4 + lVar5) = fVar13;
      }
      local_88 = uVar6 + 1;
    }
    break;
  case 0xe:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    local_88 = 0;
    local_a0 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_a0 = local_88;
    }
    while (local_88 != local_a0) {
      pvVar3 = local_a8->data;
      local_98 = local_a8->elemsize;
      local_90 = local_a8->cstep;
      pfVar11 = (float *)(local_90 * local_88 * local_98 + (long)pvVar3);
      lVar10 = 0;
      for (iVar12 = 0; iVar12 + 7 < iVar9; iVar12 = iVar12 + 8) {
        local_80[0] = *(__m256 *)pfVar11;
        afVar16 = local_80[0];
        UnaryOp_x86_fma_functor::unary_op_atan::func_pack8((unary_op_atan *)&local_a9,local_80);
        *(__m256 *)pfVar11 = afVar16;
        pfVar11 = pfVar11 + 8;
        lVar10 = lVar10 + 8;
      }
      for (; uVar6 = local_88, iVar12 + 3 < iVar9; iVar12 = iVar12 + 4) {
        local_80[0]._0_16_ = *(undefined1 (*) [16])pfVar11;
        auVar29 = ZEXT856(*(ulong *)(pfVar11 + 2));
        afVar43 = UnaryOp_x86_fma_functor::unary_op_atan::func_pack4
                            ((unary_op_atan *)&local_a9,(__m128 *)local_80);
        auVar20._0_8_ = afVar43._0_8_;
        auVar20._8_56_ = auVar29;
        *(undefined1 (*) [16])pfVar11 = auVar20._0_16_;
        pfVar11 = pfVar11 + 4;
        lVar10 = lVar10 + 4;
      }
      lVar5 = local_90 * local_98 * local_88;
      for (; (int)lVar10 < iVar9; lVar10 = lVar10 + 1) {
        fVar13 = atanf(*(float *)((long)pvVar3 + lVar10 * 4 + lVar5));
        *(float *)((long)pvVar3 + lVar10 * 4 + lVar5) = fVar13;
      }
      local_88 = uVar6 + 1;
    }
    break;
  case 0xf:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar7 = 0;
    uVar6 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar6 = uVar7;
    }
    auVar17._8_4_ = 0x3f800000;
    auVar17._0_8_ = 0x3f8000003f800000;
    auVar17._12_4_ = 0x3f800000;
    auVar17._16_4_ = 0x3f800000;
    auVar17._20_4_ = 0x3f800000;
    auVar17._24_4_ = 0x3f800000;
    auVar17._28_4_ = 0x3f800000;
    auVar31._8_4_ = 0x3f800000;
    auVar31._0_8_ = 0x3f8000003f800000;
    auVar31._12_4_ = 0x3f800000;
    for (; uVar7 != uVar6; uVar7 = uVar7 + 1) {
      pvVar3 = bottom_top_blob->data;
      sVar1 = bottom_top_blob->elemsize;
      sVar2 = bottom_top_blob->cstep;
      pauVar8 = (undefined1 (*) [32])(sVar2 * uVar7 * sVar1 + (long)pvVar3);
      lVar10 = 0;
      for (iVar12 = 0; iVar12 + 7 < iVar9; iVar12 = iVar12 + 8) {
        auVar18 = vrcpps_avx(*pauVar8);
        auVar36 = vfmsub213ps_fma(*pauVar8,auVar18,auVar17);
        auVar36 = vfnmadd132ps_fma(ZEXT1632(auVar36),auVar18,auVar18);
        *pauVar8 = ZEXT1632(auVar36);
        pauVar8 = pauVar8 + 1;
        lVar10 = lVar10 + 8;
      }
      for (; iVar12 + 3 < iVar9; iVar12 = iVar12 + 4) {
        auVar36 = vrcpps_avx(*(undefined1 (*) [16])*pauVar8);
        auVar37 = vfmsub213ps_fma(*(undefined1 (*) [16])*pauVar8,auVar36,auVar31);
        auVar36 = vfnmadd132ps_fma(auVar37,auVar36,auVar36);
        *(undefined1 (*) [16])*pauVar8 = auVar36;
        pauVar8 = (undefined1 (*) [32])(*pauVar8 + 0x10);
        lVar10 = lVar10 + 4;
      }
      lVar5 = sVar2 * sVar1 * uVar7;
      for (; (int)lVar10 < iVar9; lVar10 = lVar10 + 1) {
        *(float *)((long)pvVar3 + lVar10 * 4 + lVar5) =
             1.0 / *(float *)((long)pvVar3 + lVar10 * 4 + lVar5);
      }
    }
    break;
  case 0x10:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    local_88 = 0;
    local_a0 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_a0 = local_88;
    }
    while (local_88 != local_a0) {
      pvVar3 = local_a8->data;
      local_98 = local_a8->elemsize;
      local_90 = local_a8->cstep;
      pfVar11 = (float *)(local_90 * local_88 * local_98 + (long)pvVar3);
      lVar10 = 0;
      for (iVar12 = 0; iVar12 + 7 < iVar9; iVar12 = iVar12 + 8) {
        local_80[0] = *(__m256 *)pfVar11;
        afVar16 = local_80[0];
        UnaryOp_x86_fma_functor::unary_op_tanh::func_pack8(&local_a9,local_80);
        *(__m256 *)pfVar11 = afVar16;
        pfVar11 = pfVar11 + 8;
        lVar10 = lVar10 + 8;
      }
      for (; uVar6 = local_88, iVar12 + 3 < iVar9; iVar12 = iVar12 + 4) {
        local_80[0]._0_16_ = *(undefined1 (*) [16])pfVar11;
        auVar29 = ZEXT856(*(ulong *)(pfVar11 + 2));
        afVar43 = UnaryOp_x86_fma_functor::unary_op_tanh::func_pack4(&local_a9,(__m128 *)local_80);
        auVar19._0_8_ = afVar43._0_8_;
        auVar19._8_56_ = auVar29;
        *(undefined1 (*) [16])pfVar11 = auVar19._0_16_;
        pfVar11 = pfVar11 + 4;
        lVar10 = lVar10 + 4;
      }
      lVar5 = local_90 * local_98 * local_88;
      for (; (int)lVar10 < iVar9; lVar10 = lVar10 + 1) {
        fVar13 = tanhf(*(float *)((long)pvVar3 + lVar10 * 4 + lVar5));
        *(float *)((long)pvVar3 + lVar10 * 4 + lVar5) = fVar13;
      }
      local_88 = uVar6 + 1;
    }
    break;
  case 0x11:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    local_88 = 0;
    local_a0 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_a0 = local_88;
    }
    while (local_88 != local_a0) {
      pvVar3 = local_a8->data;
      local_98 = local_a8->elemsize;
      local_90 = local_a8->cstep;
      pfVar11 = (float *)(local_90 * local_88 * local_98 + (long)pvVar3);
      lVar10 = 0;
      for (iVar12 = 0; iVar12 + 7 < iVar9; iVar12 = iVar12 + 8) {
        local_80[0] = *(__m256 *)pfVar11;
        afVar16 = local_80[0];
        UnaryOp_x86_fma_functor::unary_op_log10::func_pack8((unary_op_log10 *)&local_a9,local_80);
        *(__m256 *)pfVar11 = afVar16;
        pfVar11 = pfVar11 + 8;
        lVar10 = lVar10 + 8;
      }
      for (; uVar6 = local_88, iVar12 + 3 < iVar9; iVar12 = iVar12 + 4) {
        local_80[0]._0_16_ = *(undefined1 (*) [16])pfVar11;
        auVar29 = ZEXT856(*(ulong *)(pfVar11 + 2));
        afVar43 = UnaryOp_x86_fma_functor::unary_op_log10::func_pack4
                            ((unary_op_log10 *)&local_a9,(__m128 *)local_80);
        auVar25._0_8_ = afVar43._0_8_;
        auVar25._8_56_ = auVar29;
        *(undefined1 (*) [16])pfVar11 = auVar25._0_16_;
        pfVar11 = pfVar11 + 4;
        lVar10 = lVar10 + 4;
      }
      lVar5 = local_90 * local_98 * local_88;
      for (; (int)lVar10 < iVar9; lVar10 = lVar10 + 1) {
        fVar13 = log10f(*(float *)((long)pvVar3 + lVar10 * 4 + lVar5));
        *(float *)((long)pvVar3 + lVar10 * 4 + lVar5) = fVar13;
      }
      local_88 = uVar6 + 1;
    }
  }
  return 0;
}

Assistant:

int UnaryOp_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    using namespace UnaryOp_x86_fma_functor;
    if (op_type == Operation_ABS)
        return unary_op_inplace<unary_op_abs>(bottom_top_blob, opt);

    if (op_type == Operation_NEG)
        return unary_op_inplace<unary_op_neg>(bottom_top_blob, opt);

    if (op_type == Operation_FLOOR)
        return unary_op_inplace<unary_op_floor>(bottom_top_blob, opt);

    if (op_type == Operation_CEIL)
        return unary_op_inplace<unary_op_ceil>(bottom_top_blob, opt);

    if (op_type == Operation_SQUARE)
        return unary_op_inplace<unary_op_square>(bottom_top_blob, opt);

    if (op_type == Operation_SQRT)
        return unary_op_inplace<unary_op_sqrt>(bottom_top_blob, opt);

    if (op_type == Operation_RSQRT)
        return unary_op_inplace<unary_op_rsqrt>(bottom_top_blob, opt);

    if (op_type == Operation_EXP)
        return unary_op_inplace<unary_op_exp>(bottom_top_blob, opt);

    if (op_type == Operation_LOG)
        return unary_op_inplace<unary_op_log>(bottom_top_blob, opt);

    if (op_type == Operation_SIN)
        return unary_op_inplace<unary_op_sin>(bottom_top_blob, opt);

    if (op_type == Operation_COS)
        return unary_op_inplace<unary_op_cos>(bottom_top_blob, opt);

    if (op_type == Operation_TAN)
        return unary_op_inplace<unary_op_tan>(bottom_top_blob, opt);

    if (op_type == Operation_ASIN)
        return unary_op_inplace<unary_op_asin>(bottom_top_blob, opt);

    if (op_type == Operation_ACOS)
        return unary_op_inplace<unary_op_acos>(bottom_top_blob, opt);

    if (op_type == Operation_ATAN)
        return unary_op_inplace<unary_op_atan>(bottom_top_blob, opt);

    if (op_type == Operation_RECIPROCAL)
        return unary_op_inplace<unary_op_reciprocal>(bottom_top_blob, opt);

    if (op_type == Operation_TANH)
        return unary_op_inplace<unary_op_tanh>(bottom_top_blob, opt);

    if (op_type == Operation_LOG10)
        return unary_op_inplace<unary_op_log10>(bottom_top_blob, opt);

    return 0;
}